

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O0

void __thiscall DiscreteSpaceInformation::~DiscreteSpaceInformation(DiscreteSpaceInformation *this)

{
  ulong uVar1;
  size_type sVar2;
  reference ppiVar3;
  undefined8 *in_RDI;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar4;
  
  *in_RDI = &PTR___cxa_pure_virtual_0011dc78;
  for (uVar4 = 0; uVar1 = (ulong)uVar4,
      sVar2 = std::vector<int_*,_std::allocator<int_*>_>::size
                        ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI + 1)), uVar1 < sVar2;
      uVar4 = uVar4 + 1) {
    ppiVar3 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                        ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI + 1),(ulong)uVar4);
    if (*ppiVar3 != (value_type)0x0) {
      ppiVar3 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                          ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI + 1),(ulong)uVar4);
      if (*ppiVar3 != (value_type)0x0) {
        operator_delete__(*ppiVar3);
      }
    }
  }
  std::vector<int_*,_std::allocator<int_*>_>::~vector
            ((vector<int_*,_std::allocator<int_*>_> *)CONCAT44(uVar4,in_stack_fffffffffffffff0));
  return;
}

Assistant:

virtual ~DiscreteSpaceInformation()
    {
        SBPL_PRINTF("destroying discretespaceinformation\n");
        for (unsigned int i = 0; i < StateID2IndexMapping.size(); ++i) {
            if (StateID2IndexMapping[i] != NULL) delete[] StateID2IndexMapping[i];
        }
        SBPL_FCLOSE(fDeb);
    }